

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

UINT8 nes_apu_read(void *chip,uint8 address)

{
  byte local_29;
  uint8 readval;
  nesapu_state *info;
  uint8 address_local;
  void *chip_local;
  
  if (address == '\x15') {
    local_29 = 0 < *(int *)((long)chip + 0xc);
    if (0 < *(int *)((long)chip + 0x2c)) {
      local_29 = local_29 | 2;
    }
    if (0 < *(int *)((long)chip + 0x50)) {
      local_29 = local_29 | 4;
    }
    if (0 < *(int *)((long)chip + 0x6c)) {
      local_29 = local_29 | 8;
    }
    if (*(char *)((long)chip + 0x99) == '\x01') {
      local_29 = local_29 | 0x10;
    }
    if (*(char *)((long)chip + 0x9a) == '\x01') {
      local_29 = local_29 | 0x80;
    }
    chip_local._7_1_ = local_29;
  }
  else {
    chip_local._7_1_ = *(byte *)((long)chip + (ulong)address + 0xb0);
  }
  return chip_local._7_1_;
}

Assistant:

uint8 nes_apu_read(void* chip, uint8 address)
{
	nesapu_state *info = (nesapu_state*)chip;
	
	if (address == 0x15) /*FIXED* Address $4015 has different behaviour*/
	{
		uint8 readval = 0;
		if (info->APU.squ[0].vbl_length > 0)
			readval |= 0x01;

		if (info->APU.squ[1].vbl_length > 0)
			readval |= 0x02;

		if (info->APU.tri.vbl_length > 0)
			readval |= 0x04;

		if (info->APU.noi.vbl_length > 0)
			readval |= 0x08;

		if (info->APU.dpcm.enabled == true)
			readval |= 0x10;

		if (info->APU.dpcm.irq_occurred == true)
			readval |= 0x80;

		return readval;
	}
	else
		return info->APU.regs[address];
}